

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError parse_args(GlobalConfig *config,int argc,char **argv)

{
  byte *nextarg;
  ParameterError res;
  OperationConfig *pOVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  ParameterError PVar5;
  OperationConfig *config_00;
  bool bVar6;
  _Bool passarg;
  _Bool used;
  _Bool local_4a;
  _Bool local_49;
  char **local_48;
  GlobalConfig *local_40;
  int local_34;
  
  res = PARAM_OK;
  if (1 < argc) {
    config_00 = config->first;
    local_34 = argc + -1;
    bVar6 = true;
    iVar4 = 1;
    local_48 = argv;
    local_40 = config;
    do {
      nextarg = (byte *)argv[iVar4];
      if ((bVar6) && (*nextarg == 0x2d)) {
        uVar3 = nextarg[1] - 0x2d;
        if (uVar3 == 0) {
          uVar3 = (uint)nextarg[2];
        }
        PVar5 = PARAM_OK;
        bVar6 = uVar3 != 0;
        res = PARAM_OK;
        if (bVar6) {
          if (iVar4 < local_34) {
            pcVar2 = argv[(long)iVar4 + 1];
          }
          else {
            pcVar2 = (char *)0x0;
          }
          res = getparameter((char *)nextarg,pcVar2,&local_4a,local_40,config_00);
          argv = local_48;
          if (res == PARAM_OK) {
            iVar4 = iVar4 + (uint)local_4a;
            res = PVar5;
          }
          else if (((res == PARAM_NEXT_OPERATION) &&
                   (res = PARAM_OK, config_00->url_list != (getout *)0x0)) &&
                  (res = PVar5, config_00->url_list->url != (char *)0x0)) {
            pOVar1 = (OperationConfig *)malloc(0x4a8);
            config_00->next = pOVar1;
            if (pOVar1 == (OperationConfig *)0x0) {
              argv = local_48;
              res = PARAM_NO_MEM;
            }
            else {
              config_init(pOVar1);
              pOVar1 = config_00->next;
              pOVar1->easy = local_40->easy;
              pOVar1->global = local_40;
              local_40->last = pOVar1;
              pOVar1->prev = config_00;
              config_00 = pOVar1;
              argv = local_48;
            }
          }
        }
      }
      else {
        res = getparameter("--url",(char *)nextarg,&local_49,local_40,config_00);
      }
      iVar4 = iVar4 + 1;
    } while ((iVar4 < argc) && (res == PARAM_OK));
    if ((res < PARAM_GOT_EXTRA_PARAMETER) &&
       ((0x1e1U >> (res & (PARAM_NO_PREFIX|PARAM_NEXT_OPERATION)) & 1) != 0)) {
      res = (&DAT_0011d258)[res];
    }
    else {
      pcVar2 = param2text(res);
      if (nextarg != (byte *)0x0) {
        uVar3 = *nextarg - 0x3a;
        if (uVar3 == 0) {
          uVar3 = (uint)nextarg[1];
        }
        if (uVar3 != 0) {
          helpf(local_40->errors,"option %s: %s\n",nextarg,pcVar2);
          return res;
        }
      }
      helpf(local_40->errors,"%s\n",pcVar2);
    }
  }
  return res;
}

Assistant:

ParameterError parse_args(struct GlobalConfig *config, int argc,
                          argv_item_t argv[])
{
  int i;
  bool stillflags;
  char *orig_opt = NULL;
  ParameterError result = PARAM_OK;
  struct OperationConfig *operation = config->first;

  for(i = 1, stillflags = TRUE; i < argc && !result; i++) {
    orig_opt = argv[i];

    if(stillflags && ('-' == argv[i][0])) {
      bool passarg;
      char *flag = argv[i];

      if(!strcmp("--", argv[i]))
        /* This indicates the end of the flags and thus enables the
           following (URL) argument to start with -. */
        stillflags = FALSE;
      else {
        char *nextarg = (i < (argc - 1)) ? argv[i + 1] : NULL;

        result = getparameter(flag, nextarg, &passarg, config, operation);
        if(result == PARAM_NEXT_OPERATION) {
          /* Reset result as PARAM_NEXT_OPERATION is only used here and not
             returned from this function */
          result = PARAM_OK;

          if(operation->url_list && operation->url_list->url) {
            /* Allocate the next config */
            operation->next = malloc(sizeof(struct OperationConfig));
            if(operation->next) {
              /* Initialise the newly created config */
              config_init(operation->next);

              /* Copy the easy handle */
              operation->next->easy = config->easy;

              /* Set the global config pointer */
              operation->next->global = config;

              /* Update the last operation pointer */
              config->last = operation->next;

              /* Move onto the new config */
              operation->next->prev = operation;
              operation = operation->next;
            }
            else
              result = PARAM_NO_MEM;
          }
        }
        else if(!result && passarg)
          i++; /* we're supposed to skip this */
      }
    }
    else {
      bool used;

      /* Just add the URL please */
      result = getparameter((char *)"--url", argv[i], &used, config,
                            operation);
    }
  }

  if(result && result != PARAM_HELP_REQUESTED &&
     result != PARAM_MANUAL_REQUESTED &&
     result != PARAM_VERSION_INFO_REQUESTED &&
     result != PARAM_ENGINES_REQUESTED) {
    const char *reason = param2text(result);

    if(orig_opt && strcmp(":", orig_opt))
      helpf(config->errors, "option %s: %s\n", orig_opt, reason);
    else
      helpf(config->errors, "%s\n", reason);
  }

  return result;
}